

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O3

bool slang::ast::TaggedPattern::createVars
               (ASTContext *context,TaggedPatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  PatternSyntax *syntax_00;
  bool bVar1;
  Scope *this;
  Symbol *pSVar2;
  Type *pTVar3;
  Diagnostic *pDVar4;
  string_view name;
  SourceRange SVar5;
  
  bVar1 = Type::isTaggedUnion(targetType);
  if (bVar1) {
    name = parsing::Token::valueText(&syntax->memberName);
    pTVar3 = targetType->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(targetType);
      pTVar3 = targetType->canonical;
    }
    this = Symbol::scopeOrNull(&pTVar3->super_Symbol);
    pSVar2 = Scope::find(this,name);
    if (pSVar2 != (Symbol *)0x0) {
      syntax_00 = syntax->pattern;
      if (syntax_00 == (PatternSyntax *)0x0) {
        return true;
      }
      pTVar3 = DeclaredType::getType((DeclaredType *)(pSVar2 + 1));
      bVar1 = Pattern::createPatternVars(context,syntax_00,pTVar3,results);
      return bVar1;
    }
    if (name._M_len != 0) {
      SVar5 = parsing::Token::range(&syntax->memberName);
      pDVar4 = ASTContext::addDiag(context,(DiagCode)0x3a000a,SVar5);
      pDVar4 = Diagnostic::operator<<(pDVar4,name);
      ast::operator<<(pDVar4,targetType);
    }
  }
  else {
    pTVar3 = targetType->canonical;
    if (pTVar3 == (Type *)0x0) {
      Type::resolveCanonical(targetType);
      pTVar3 = targetType->canonical;
    }
    if ((pTVar3->super_Symbol).kind != ErrorType) {
      SVar5 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar4 = ASTContext::addDiag(context,(DiagCode)0x880007,SVar5);
      ast::operator<<(pDVar4,targetType);
    }
  }
  Pattern::createPlaceholderVars(context,&syntax->super_PatternSyntax,results);
  return false;
}

Assistant:

bool TaggedPattern::createVars(const ASTContext& context, const syntax::TaggedPatternSyntax& syntax,
                               const Type& targetType,
                               SmallVector<const PatternVarSymbol*>& results) {
    if (!targetType.isTaggedUnion()) {
        if (!targetType.isError())
            context.addDiag(diag::PatternTaggedType, syntax.sourceRange()) << targetType;

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    auto memberName = syntax.memberName.valueText();
    auto member = targetType.getCanonicalType().as<Scope>().find(memberName);
    if (!member) {
        if (!memberName.empty()) {
            auto& diag = context.addDiag(diag::UnknownMember, syntax.memberName.range());
            diag << memberName << targetType;
        }

        createPlaceholderVars(context, syntax, results);
        return false;
    }

    if (!syntax.pattern)
        return true;

    auto& field = member->as<FieldSymbol>();
    return createPatternVars(context, *syntax.pattern, field.getType(), results);
}